

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

char * cmGetFilenameWithoutExtension(char *name)

{
  long lVar1;
  char *__dest;
  char *__src;
  char *result;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  string sres;
  char *name_local;
  
  sres.field_2._8_8_ = name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,name,&local_51);
  cmsys::SystemTools::GetFilenameWithoutExtension((string *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  lVar1 = std::__cxx11::string::size();
  __dest = (char *)malloc(lVar1 + 1);
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(__dest,__src);
  std::__cxx11::string::~string((string *)local_30);
  return __dest;
}

Assistant:

char* CCONV cmGetFilenameWithoutExtension(const char* name)
{
  std::string sres = cmSystemTools::GetFilenameWithoutExtension(name);
  char* result = (char*)malloc(sres.size() + 1);
  strcpy(result, sres.c_str());
  return result;
}